

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.c
# Opt level: O0

void Panning_Calculate(INT32 *channels,INT16 position)

{
  double dVar1;
  short local_12;
  INT16 position_local;
  INT32 *channels_local;
  
  if (position < 0x101) {
    local_12 = position;
    if (position < -0x100) {
      local_12 = -0x100;
    }
  }
  else {
    local_12 = 0x100;
  }
  dVar1 = sin((double)(int)(short)(local_12 + 0x100) * 0.0030679615757712823);
  channels[1] = (int)(dVar1 * 1.4142135623730951 * 65536.0);
  dVar1 = sin((double)(int)(short)(0x200 - (local_12 + 0x100)) * 0.0030679615757712823);
  *channels = (int)(dVar1 * 1.4142135623730951 * 65536.0);
  return;
}

Assistant:

void Panning_Calculate(INT32 channels[2], INT16 position)
{
	if ( position > RANGE / 2 )
		position = RANGE / 2;
	else if ( position < -RANGE / 2 )
		position = -RANGE / 2;
	position += RANGE / 2;	// make -256..0..256 -> 0..256..512
	
	// Equal power law: equation is
	// right = sin( position / range * pi / 2) * sqrt( 2 )
	// left is equivalent to right with position = range - position
	// position is in the range 0 .. RANGE
	// RANGE / 2 = centre, result = 1.0f
	channels[1] = (INT32)( sin((double)position * POS_MULT) * M_SQRT2 * PANNING_NORMAL );
	position = RANGE - position;
	channels[0] = (INT32)( sin((double)position * POS_MULT) * M_SQRT2 * PANNING_NORMAL );
}